

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_swift.cpp
# Opt level: O1

void __thiscall
flatbuffers::swift::SwiftGenerator::GenerateStructArgs
          (SwiftGenerator *this,StructDef *struct_def,string *code_ptr,string *nameprefix,
          string *object_name,string *obj_api_named,bool is_obj_api)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  FieldDef *field;
  StructDef *struct_def_00;
  pointer pcVar2;
  IdlNamer *pIVar3;
  long *plVar4;
  size_type *psVar5;
  long *plVar6;
  pointer ppFVar7;
  undefined8 uVar8;
  _Alloc_hider _Var9;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar10;
  string field_var;
  string field_field;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string local_188;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_168;
  string *local_148;
  long *local_140;
  long local_138;
  long local_130;
  long lStack_128;
  string local_120;
  SwiftGenerator *local_100;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_d8;
  string local_d0;
  string *local_b0;
  string *local_a8;
  StructDef *local_a0;
  long *local_98;
  long local_90;
  long local_88;
  long lStack_80;
  long *local_78;
  long local_70;
  long local_68;
  long lStack_60;
  IdlNamer *local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  ppFVar7 = (struct_def->fields).vec.
            super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if (ppFVar7 !=
      (struct_def->fields).vec.
      super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    local_58 = &this->namer_;
    paVar1 = &local_d0.field_2;
    local_148 = code_ptr;
    local_100 = this;
    local_d8 = nameprefix;
    local_b0 = obj_api_named;
    local_a8 = object_name;
    local_a0 = struct_def;
    do {
      pIVar3 = local_58;
      paVar10 = &local_f8.field_2;
      field = *ppFVar7;
      if (field->deprecated == false) {
        if (((field->value).type.base_type == BASE_TYPE_STRUCT) &&
           (((field->value).type.struct_def)->fixed == true)) {
          struct_def_00 = (field->value).type.struct_def;
          std::operator+(&local_168,local_d8,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)field)
          ;
          pcVar2 = (local_a8->_M_dataplus)._M_p;
          local_d0._M_dataplus._M_p = (pointer)paVar1;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_d0,pcVar2,pcVar2 + local_a8->_M_string_length);
          std::__cxx11::string::append((char *)&local_d0);
          plVar4 = (long *)std::__cxx11::string::_M_append
                                     ((char *)&local_d0,
                                      (ulong)(field->super_Definition).name._M_dataplus._M_p);
          local_120._M_dataplus._M_p = (pointer)&local_120.field_2;
          psVar5 = (size_type *)(plVar4 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar4 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar5) {
            local_120.field_2._M_allocated_capacity = *psVar5;
            local_120.field_2._8_8_ = plVar4[3];
          }
          else {
            local_120.field_2._M_allocated_capacity = *psVar5;
            local_120._M_dataplus._M_p = (pointer)*plVar4;
          }
          local_120._M_string_length = plVar4[1];
          *plVar4 = (long)psVar5;
          plVar4[1] = 0;
          *(undefined1 *)(plVar4 + 2) = 0;
          GenerateStructArgs(local_100,struct_def_00,local_148,&local_168,&local_120,local_b0,
                             is_obj_api);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_120._M_dataplus._M_p != &local_120.field_2) {
            operator_delete(local_120._M_dataplus._M_p,local_120.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_d0._M_dataplus._M_p != paVar1) {
            operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
          }
          struct_def = local_a0;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_168._M_dataplus._M_p != &local_168.field_2) {
            operator_delete(local_168._M_dataplus._M_p,local_168.field_2._M_allocated_capacity + 1);
            struct_def = local_a0;
          }
        }
        else {
          (*(local_58->super_Namer)._vptr_Namer[7])(&local_168,local_58,field);
          (*(pIVar3->super_Namer)._vptr_Namer[0x12])(&local_120,pIVar3,field);
          GenType_abi_cxx11_(&local_d0,local_100,&(field->value).type,false);
          if (is_obj_api) {
            std::operator+(&local_50,local_d8,&local_168);
            plVar4 = (long *)std::__cxx11::string::append((char *)&local_50);
            local_98 = &local_88;
            plVar6 = plVar4 + 2;
            if ((long *)*plVar4 == plVar6) {
              local_88 = *plVar6;
              lStack_80 = plVar4[3];
            }
            else {
              local_88 = *plVar6;
              local_98 = (long *)*plVar4;
            }
            local_90 = plVar4[1];
            *plVar4 = (long)plVar6;
            plVar4[1] = 0;
            *(undefined1 *)(plVar4 + 2) = 0;
            plVar4 = (long *)std::__cxx11::string::_M_append
                                       ((char *)&local_98,(ulong)(local_b0->_M_dataplus)._M_p);
            local_78 = &local_68;
            plVar6 = plVar4 + 2;
            if ((long *)*plVar4 == plVar6) {
              local_68 = *plVar6;
              lStack_60 = plVar4[3];
            }
            else {
              local_68 = *plVar6;
              local_78 = (long *)*plVar4;
            }
            local_70 = plVar4[1];
            *plVar4 = (long)plVar6;
            plVar4[1] = 0;
            *(undefined1 *)(plVar4 + 2) = 0;
            plVar4 = (long *)std::__cxx11::string::_M_append
                                       ((char *)&local_78,(ulong)(local_a8->_M_dataplus)._M_p);
            psVar5 = (size_type *)(plVar4 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar4 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar5) {
              local_f8.field_2._M_allocated_capacity = *psVar5;
              local_f8.field_2._8_8_ = plVar4[3];
              local_f8._M_dataplus._M_p = (pointer)paVar10;
            }
            else {
              local_f8.field_2._M_allocated_capacity = *psVar5;
              local_f8._M_dataplus._M_p = (pointer)*plVar4;
            }
            local_f8._M_string_length = plVar4[1];
            *plVar4 = (long)psVar5;
            plVar4[1] = 0;
            *(undefined1 *)(plVar4 + 2) = 0;
            plVar4 = (long *)std::__cxx11::string::append((char *)&local_f8);
            local_140 = &local_130;
            plVar6 = plVar4 + 2;
            if ((long *)*plVar4 == plVar6) {
              local_130 = *plVar6;
              lStack_128 = plVar4[3];
            }
            else {
              local_130 = *plVar6;
              local_140 = (long *)*plVar4;
            }
            local_138 = plVar4[1];
            *plVar4 = (long)plVar6;
            plVar4[1] = 0;
            *(undefined1 *)(plVar4 + 2) = 0;
            plVar4 = (long *)std::__cxx11::string::_M_append
                                       ((char *)&local_140,(ulong)local_120._M_dataplus._M_p);
            local_188._M_dataplus._M_p = (pointer)&local_188.field_2;
            psVar5 = (size_type *)(plVar4 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar4 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar5) {
              local_188.field_2._M_allocated_capacity = *psVar5;
              local_188.field_2._8_8_ = plVar4[3];
            }
            else {
              local_188.field_2._M_allocated_capacity = *psVar5;
              local_188._M_dataplus._M_p = (pointer)*plVar4;
            }
            local_188._M_string_length = plVar4[1];
            *plVar4 = (long)psVar5;
            plVar4[1] = 0;
            *(undefined1 *)(plVar4 + 2) = 0;
            std::__cxx11::string::_M_append((char *)local_148,(ulong)local_188._M_dataplus._M_p);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_188._M_dataplus._M_p != &local_188.field_2) {
              operator_delete(local_188._M_dataplus._M_p,local_188.field_2._M_allocated_capacity + 1
                             );
            }
            if (local_140 != &local_130) {
              operator_delete(local_140,local_130 + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_f8._M_dataplus._M_p != paVar10) {
              operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
            }
            if (local_78 != &local_68) {
              operator_delete(local_78,local_68 + 1);
            }
            if (local_98 != &local_88) {
              operator_delete(local_98,local_88 + 1);
            }
            uVar8 = local_50.field_2._M_allocated_capacity;
            _Var9._M_p = local_50._M_dataplus._M_p;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_50._M_dataplus._M_p != &local_50.field_2) {
LAB_002f9702:
              operator_delete(_Var9._M_p,uVar8 + 1);
            }
          }
          else {
            std::operator+(&local_f8,local_d8,&local_168);
            plVar4 = (long *)std::__cxx11::string::append((char *)&local_f8);
            local_140 = &local_130;
            plVar6 = plVar4 + 2;
            if ((long *)*plVar4 == plVar6) {
              local_130 = *plVar6;
              lStack_128 = plVar4[3];
            }
            else {
              local_130 = *plVar6;
              local_140 = (long *)*plVar4;
            }
            local_138 = plVar4[1];
            *plVar4 = (long)plVar6;
            plVar4[1] = 0;
            *(undefined1 *)(plVar4 + 2) = 0;
            plVar4 = (long *)std::__cxx11::string::_M_append
                                       ((char *)&local_140,(ulong)local_d0._M_dataplus._M_p);
            local_188._M_dataplus._M_p = (pointer)&local_188.field_2;
            psVar5 = (size_type *)(plVar4 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar4 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar5) {
              local_188.field_2._M_allocated_capacity = *psVar5;
              local_188.field_2._8_8_ = plVar4[3];
            }
            else {
              local_188.field_2._M_allocated_capacity = *psVar5;
              local_188._M_dataplus._M_p = (pointer)*plVar4;
            }
            local_188._M_string_length = plVar4[1];
            *plVar4 = (long)psVar5;
            plVar4[1] = 0;
            *(undefined1 *)(plVar4 + 2) = 0;
            std::__cxx11::string::_M_append((char *)local_148,(ulong)local_188._M_dataplus._M_p);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_188._M_dataplus._M_p != &local_188.field_2) {
              operator_delete(local_188._M_dataplus._M_p,local_188.field_2._M_allocated_capacity + 1
                             );
            }
            if (local_140 != &local_130) {
              operator_delete(local_140,local_130 + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_f8._M_dataplus._M_p != paVar10) {
              operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
            }
            if (((field->value).type.enum_def == (EnumDef *)0x0) ||
               (9 < (field->value).type.base_type - BASE_TYPE_UTYPE)) {
              std::__cxx11::string::append((char *)local_148);
              SwiftConstant_abi_cxx11_(&local_188,local_100,field);
              std::__cxx11::string::_M_append((char *)local_148,(ulong)local_188._M_dataplus._M_p);
              uVar8 = local_188.field_2._M_allocated_capacity;
              _Var9._M_p = local_188._M_dataplus._M_p;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_188._M_dataplus._M_p != &local_188.field_2) goto LAB_002f9702;
            }
          }
          std::__cxx11::string::append((char *)local_148);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_d0._M_dataplus._M_p != paVar1) {
            operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_120._M_dataplus._M_p != &local_120.field_2) {
            operator_delete(local_120._M_dataplus._M_p,local_120.field_2._M_allocated_capacity + 1);
          }
          struct_def = local_a0;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_168._M_dataplus._M_p != &local_168.field_2) {
            operator_delete(local_168._M_dataplus._M_p,local_168.field_2._M_allocated_capacity + 1);
            struct_def = local_a0;
          }
        }
      }
      ppFVar7 = ppFVar7 + 1;
    } while (ppFVar7 !=
             (struct_def->fields).vec.
             super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>.
             _M_impl.super__Vector_impl_data._M_finish);
  }
  return;
}

Assistant:

void GenerateStructArgs(const StructDef &struct_def, std::string *code_ptr,
                          const std::string &nameprefix,
                          const std::string &object_name,
                          const std::string &obj_api_named = "",
                          bool is_obj_api = false) {
    auto &code = *code_ptr;
    for (auto it = struct_def.fields.vec.begin();
         it != struct_def.fields.vec.end(); ++it) {
      const auto &field = **it;
      if (field.deprecated) continue;
      const auto &field_type = field.value.type;
      if (IsStruct(field.value.type)) {
        GenerateStructArgs(
            *field_type.struct_def, code_ptr, (nameprefix + field.name),
            (object_name + "." + field.name), obj_api_named, is_obj_api);
      } else {
        const auto field_var = namer_.Variable(field);
        const auto field_field = namer_.Field(field);
        const auto type = GenType(field.value.type);
        if (!is_obj_api) {
          code += nameprefix + field_var + ": " + type;
          if (!IsEnum(field.value.type)) {
            code += " = ";
            code += SwiftConstant(field);
          }
          code += ", ";
          continue;
        }
        code += nameprefix + field_var + ": " + obj_api_named + object_name +
                "." + field_field;
        code += ", ";
      }
    }
  }